

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O3

vector<CScript,_std::allocator<CScript>_> * __thiscall
anon_unknown.dwarf_29c3b1::WSHDescriptor::MakeScripts
          (vector<CScript,_std::allocator<CScript>_> *__return_storage_ptr__,WSHDescriptor *this,
          vector<CPubKey,_std::allocator<CPubKey>_> *param_1,Span<const_CScript> scripts,
          FlatSigningProvider *out)

{
  CScript *in;
  long in_FS_OFFSET;
  WitnessV0ScriptHash local_b8;
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_98;
  undefined1 local_50;
  direct_or_indirect local_48;
  uint local_2c;
  long local_28;
  
  in = scripts.m_data;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  WitnessV0ScriptHash::WitnessV0ScriptHash(&local_b8,in);
  local_98._M_first._M_storage._M_storage[0x10] =
       local_b8.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x10];
  local_98._M_first._M_storage._M_storage[0x11] =
       local_b8.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x11];
  local_98._M_first._M_storage._M_storage[0x12] =
       local_b8.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x12];
  local_98._M_first._M_storage._M_storage[0x13] =
       local_b8.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x13];
  local_98._M_first._M_storage._M_storage[0x14] =
       local_b8.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x14];
  local_98._M_first._M_storage._M_storage[0x15] =
       local_b8.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x15];
  local_98._M_first._M_storage._M_storage[0x16] =
       local_b8.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x16];
  local_98._M_first._M_storage._M_storage[0x17] =
       local_b8.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x17];
  local_98._M_first._M_storage._M_storage[0x18] =
       local_b8.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x18];
  local_98._M_first._M_storage._M_storage[0x19] =
       local_b8.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x19];
  local_98._M_first._M_storage._M_storage[0x1a] =
       local_b8.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x1a];
  local_98._M_first._M_storage._M_storage[0x1b] =
       local_b8.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x1b];
  local_98._M_first._M_storage._M_storage[0x1c] =
       local_b8.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x1c];
  local_98._M_first._M_storage._M_storage[0x1d] =
       local_b8.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x1d];
  local_98._M_first._M_storage._M_storage[0x1e] =
       local_b8.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x1e];
  local_98._M_first._M_storage._M_storage[0x1f] =
       local_b8.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0x1f];
  local_98._M_first._M_storage._M_storage[0] =
       local_b8.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0];
  local_98._M_first._M_storage._M_storage[1] =
       local_b8.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[1];
  local_98._M_first._M_storage._M_storage[2] =
       local_b8.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[2];
  local_98._M_first._M_storage._M_storage[3] =
       local_b8.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[3];
  local_98._M_first._M_storage._M_storage[4] =
       local_b8.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[4];
  local_98._M_first._M_storage._M_storage[5] =
       local_b8.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[5];
  local_98._M_first._M_storage._M_storage[6] =
       local_b8.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[6];
  local_98._M_first._M_storage._M_storage[7] =
       local_b8.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[7];
  local_98._M_first._M_storage._M_storage[8] =
       local_b8.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[8];
  local_98._M_first._M_storage._M_storage[9] =
       local_b8.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[9];
  local_98._M_first._M_storage._M_storage[10] =
       local_b8.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[10];
  local_98._M_first._M_storage._M_storage[0xb] =
       local_b8.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xb];
  local_98._M_first._M_storage._M_storage[0xc] =
       local_b8.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xc];
  local_98._M_first._M_storage._M_storage[0xd] =
       local_b8.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xd];
  local_98._M_first._M_storage._M_storage[0xe] =
       local_b8.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xe];
  local_98._M_first._M_storage._M_storage[0xf] =
       local_b8.super_BaseHash<uint256>.m_hash.super_base_blob<256U>.m_data._M_elems[0xf];
  local_50 = 4;
  GetScriptForDestination
            ((CScript *)&local_48.indirect_contents,(CTxDestination *)&local_98._M_first);
  (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<CScript,_std::allocator<CScript>_>::reserve(__return_storage_ptr__,1);
  std::vector<CScript,_std::allocator<CScript>_>::emplace_back<CScript>
            (__return_storage_ptr__,(CScript *)&local_48.indirect_contents);
  if (0x1c < local_2c) {
    free(local_48.indirect_contents.indirect);
    local_48.indirect_contents.indirect = (char *)0x0;
  }
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&local_98._M_first);
  if ((__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    CScriptID::CScriptID((CScriptID *)&local_98._M_first,in);
    std::
    _Rb_tree<CScriptID,std::pair<CScriptID_const,CScript>,std::_Select1st<std::pair<CScriptID_const,CScript>>,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>
    ::_M_emplace_unique<CScriptID,CScript_const&>
              ((_Rb_tree<CScriptID,std::pair<CScriptID_const,CScript>,std::_Select1st<std::pair<CScriptID_const,CScript>>,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>
                *)&out->scripts,(CScriptID *)&local_98._M_first,in);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CScript> MakeScripts(const std::vector<CPubKey>&, Span<const CScript> scripts, FlatSigningProvider& out) const override
    {
        auto ret = Vector(GetScriptForDestination(WitnessV0ScriptHash(scripts[0])));
        if (ret.size()) out.scripts.emplace(CScriptID(scripts[0]), scripts[0]);
        return ret;
    }